

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

void __thiscall
fmt::v9::detail::buffer<char>::append<char>(buffer<char> *this,char *begin,char *end)

{
  type tVar1;
  size_t sVar2;
  ptrdiff_t _Num;
  ulong uVar3;
  ulong __n;
  
  for (; begin != end; begin = begin + __n) {
    tVar1 = to_unsigned<long>((long)end - (long)begin);
    sVar2 = this->size_;
    uVar3 = this->capacity_;
    if (uVar3 < sVar2 + tVar1) {
      (**this->_vptr_buffer)(this);
      sVar2 = this->size_;
      uVar3 = this->capacity_;
    }
    __n = uVar3 - sVar2;
    if (tVar1 <= uVar3 - sVar2) {
      __n = tVar1;
    }
    if (__n != 0) {
      memmove(this->ptr_ + sVar2,begin,__n);
      sVar2 = this->size_;
    }
    this->size_ = sVar2 + __n;
  }
  return;
}

Assistant:

void buffer<T>::append(const U* begin, const U* end) {
  while (begin != end) {
    auto count = to_unsigned(end - begin);
    try_reserve(size_ + count);
    auto free_cap = capacity_ - size_;
    if (free_cap < count) count = free_cap;
    std::uninitialized_copy_n(begin, count, make_checked(ptr_ + size_, count));
    size_ += count;
    begin += count;
  }
}